

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

void big2_updatePosition(ENCODING *enc,char *ptr,char *end,POSITION *pos)

{
  byte *pbVar1;
  unsigned_long uVar2;
  
  if (ptr != end) {
    uVar2 = pos->columnNumber;
    do {
      if ((byte)*ptr - 0xd8 < 4) {
switchD_0015bffe_caseD_7:
        ptr = (char *)((byte *)ptr + 4);
        goto LAB_0015c008;
      }
      if (*ptr == 0) {
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1])) {
        default:
          goto switchD_0015bffe_caseD_5;
        case 6:
          ptr = (char *)((byte *)ptr + 3);
          break;
        case 7:
          goto switchD_0015bffe_caseD_7;
        case 9:
          pos->lineNumber = pos->lineNumber + 1;
          pbVar1 = (byte *)ptr + 2;
          if (((pbVar1 != (byte *)end) && (*pbVar1 == 0)) &&
             (*(char *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]) == '\n')) {
            pbVar1 = (byte *)ptr + 4;
          }
          uVar2 = 0xffffffff;
          ptr = (char *)pbVar1;
          break;
        case 10:
          pos->lineNumber = pos->lineNumber + 1;
          ptr = (char *)((byte *)ptr + 2);
          uVar2 = 0xffffffff;
        }
      }
      else {
switchD_0015bffe_caseD_5:
        ptr = (char *)((byte *)ptr + 2);
      }
LAB_0015c008:
      uVar2 = uVar2 + 1;
      pos->columnNumber = uVar2;
    } while (ptr != end);
  }
  return;
}

Assistant:

static
void PREFIX(updatePosition)(const ENCODING *enc,
                            const char *ptr,
                            const char *end,
                            POSITION *pos)
{
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_LF:
      pos->columnNumber = (unsigned)-1;
      pos->lineNumber++;
      ptr += MINBPC(enc);
      break;
    case BT_CR:
      pos->lineNumber++;
      ptr += MINBPC(enc);
      if (ptr != end && BYTE_TYPE(enc, ptr) == BT_LF)
        ptr += MINBPC(enc);
      pos->columnNumber = (unsigned)-1;
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
    pos->columnNumber++;
  }
}